

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  basic_fp<unsigned___int128> value_00;
  uint64_t divisor;
  int iVar4;
  result rVar5;
  long lVar6;
  decimal_fp<float> dVar7;
  format_error *this;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t *puVar12;
  uint64_t error;
  char cVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  decimal_fp<double> dVar21;
  gen_digits_handler handler;
  int local_c4;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  gen_digits_handler local_a8;
  int local_8c;
  buffer<char> *local_88;
  uint64_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  uVar11 = (ulong)(uint)precision;
  local_b8 = (ulong)specs & 0xff00000000;
  local_a8.fixed = local_b8 == 0x200000000;
  local_b0 = value;
  if (value <= 0.0) {
    if (0 < precision && local_b8 == 0x200000000) {
      uVar20 = buf->capacity_;
      if (uVar20 < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
        uVar20 = buf->capacity_;
      }
      if (uVar11 <= uVar20) {
        uVar20 = uVar11;
      }
      buf->size_ = uVar20;
      memset(buf->ptr_,0x30,uVar11);
      return -precision;
    }
    sVar18 = buf->size_;
    uVar11 = sVar18 + 1;
    if (buf->capacity_ < uVar11) {
      (**buf->_vptr_buffer)(buf);
      sVar18 = buf->size_;
      uVar11 = sVar18 + 1;
    }
    buf->size_ = uVar11;
    buf->ptr_[sVar18] = '0';
    return 0;
  }
  local_c0 = (ulong)specs >> 0x20;
  uVar19 = specs._4_4_;
  if (precision < 0) {
    if ((uVar19 >> 0x12 & 1) == 0) {
      dVar21 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v9::appender,_unsigned_long,_0>((appender)buf,dVar21.significand);
      return dVar21.exponent;
    }
    dVar7 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v9::appender,_unsigned_int,_0>((appender)buf,dVar7.significand);
    return dVar7.exponent;
  }
  local_68 = (ulong)value & 0x7ff0000000000000;
  local_70 = (ulong)value & 0xfffffffffffff;
  iVar15 = (uint)(local_68 >> 0x34) - 0x433;
  local_8c = -0x432;
  if (local_68 == 0) {
    lVar1 = 0x3f;
    if (local_70 != 0) {
      for (; local_70 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    lVar6 = local_70 << (~(byte)lVar1 + 0x35 & 0x3f);
    iVar15 = ((uint)lVar1 ^ 0xffffffc0) - 0x426;
  }
  else {
    lVar6 = local_70 + 0x10000000000000;
    local_8c = iVar15;
  }
  iVar4 = (int)((ulong)((long)(-0x32 - iVar15) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar9 = iVar4 + 0x15b;
  uVar16 = iVar4 + 0x162;
  if (-1 < (int)uVar9) {
    uVar16 = uVar9;
  }
  local_60 = (ulong)(uVar16 & 0xfffffff8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = lVar6 << 0xb;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = basic_data<void>::pow10_significands[(long)((int)uVar16 >> 3) + 1];
  uVar20 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
  bVar8 = -((char)basic_data<void>::pow10_exponents[(long)((int)uVar16 >> 3) + 1] + (char)iVar15) -
          0x35;
  local_a8.exp10 = 0x154 - (uVar16 & 0xfffffff8);
  local_80 = 1L << (bVar8 & 0x3f);
  uVar11 = uVar20 >> (bVar8 & 0x3f);
  uVar9 = (uint)uVar11 | 1;
  uVar16 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  uVar10 = (uVar11 & 0xffffffff) +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar16 * 8);
  uVar17 = uVar10 >> 0x20;
  uVar16 = (uint)(uVar10 >> 0x20);
  local_a8.buf = buf->ptr_;
  local_a8.size = 0;
  local_a8.precision = precision;
  if (local_b8 == 0x200000000) {
    uVar9 = local_a8.exp10 + uVar16;
    if ((uVar9 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar9) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    local_a8.precision = uVar9 + precision;
    if (local_a8.precision != 0 && SCARRY4(uVar9,precision) == local_a8.precision < 0)
    goto LAB_0012896a;
    if (local_a8.precision < 0) {
      uVar11 = 0;
      goto LAB_00128d16;
    }
    lVar6 = basic_data<void>::power_of_10_64[(long)(uVar10 - 0x100000000) >> 0x20] << (bVar8 & 0x3f)
    ;
    uVar11 = uVar20 / 10;
    if (((uVar11 <= lVar6 - uVar11) && (cVar13 = '0', 0x13 < lVar6 + uVar11 * -2)) ||
       ((iVar15 = 0, 99 < uVar20 && (cVar13 = '1', lVar6 - (uVar11 - 10) <= uVar11 - 10)))) {
      local_a8.size = 1;
      *local_a8.buf = cVar13;
      uVar11 = 1;
      goto LAB_00128d16;
    }
  }
  else {
LAB_0012896a:
    local_78 = local_80 - 1;
    uVar20 = uVar20 & local_78;
    puVar12 = basic_data<void>::power_of_10_64 + (int)(uVar16 - 1);
    local_88 = buf;
    do {
      iVar15 = (int)uVar17;
      uVar16 = iVar15 - 1;
      uVar17 = (ulong)uVar16;
      switch(uVar17) {
      case 0:
        cVar13 = (char)uVar11;
        uVar11 = 0;
        goto LAB_00128a88;
      case 1:
        cVar13 = (char)((uVar11 & 0xffffffff) / 10);
        iVar4 = (int)((uVar11 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar13 = (char)((uVar11 & 0xffffffff) / 100);
        iVar4 = (int)((uVar11 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar13 = (char)((uVar11 & 0xffffffff) / 1000);
        iVar4 = (int)((uVar11 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar13 = (char)((uVar11 & 0xffffffff) / 10000);
        iVar4 = (int)((uVar11 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar10 = uVar11 >> 5 & 0x7ffffff;
        cVar13 = (char)(uVar10 / 0xc35);
        iVar4 = (int)(uVar10 / 0xc35) * 100000;
        break;
      case 6:
        cVar13 = (char)((uVar11 & 0xffffffff) / 1000000);
        iVar4 = (int)((uVar11 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar13 = (char)((uVar11 & 0xffffffff) / 10000000);
        iVar4 = (int)((uVar11 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar13 = (char)((uVar11 & 0xffffffff) / 100000000);
        iVar4 = (int)((uVar11 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar10 = (uVar11 >> 9 & 0x7fffff) * 0x44b83;
        cVar13 = (char)(uVar10 >> 0x27);
        iVar4 = (uint)(uVar10 >> 0x27) * 1000000000;
        break;
      default:
        cVar13 = '\0';
        goto LAB_00128a88;
      }
      uVar11 = (ulong)(uint)((int)uVar11 - iVar4);
LAB_00128a88:
      rVar5 = gen_digits_handler::on_digit
                        (&local_a8,cVar13 + '0',*puVar12 << (bVar8 & 0x3f),
                         ((uVar11 & 0xffffffff) << (bVar8 & 0x3f)) + uVar20,1,true);
      divisor = local_80;
      if (rVar5 != more) goto LAB_00128b24;
      puVar12 = puVar12 + -1;
    } while (1 < iVar15);
    error = 1;
    do {
      uVar11 = uVar20 * 10;
      error = error * 10;
      uVar20 = uVar11 & local_78;
      uVar16 = (int)uVar17 - 1;
      uVar17 = (ulong)uVar16;
      rVar5 = gen_digits_handler::on_digit
                        (&local_a8,(char)(uVar11 >> (bVar8 & 0x3f)) + '0',divisor,uVar20,error,false
                        );
    } while (rVar5 == more);
LAB_00128b24:
    uVar11 = (ulong)(uint)local_a8.size;
    uVar19 = (uint)local_c0;
    buf = local_88;
    iVar15 = local_a8.precision;
    if (rVar5 != error) {
LAB_00128d16:
      uVar10 = local_b8;
      local_c4 = uVar16 + local_a8.exp10;
      uVar20 = buf->capacity_;
      if (uVar20 < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
        uVar20 = buf->capacity_;
      }
      if (uVar20 < uVar11) {
        uVar11 = uVar20;
      }
      buf->size_ = uVar11;
      goto LAB_00128d50;
    }
  }
  uVar10 = local_b8;
  local_c4 = (local_a8.size - ((int)local_60 + 8)) + uVar16 + 0x15b;
  if ((uVar19 >> 0x12 & 1) == 0) {
    local_58 = local_70 | 0x10000000000000;
    if (local_68 == 0) {
      local_58 = local_70;
    }
    bVar14 = local_68 >> 0x35 != 0 && local_70 == 0;
    local_48 = local_8c;
  }
  else {
    uVar9 = (uint)(float)local_b0 & 0x7fffff;
    uVar16 = (uint)(float)local_b0 & 0x7f800000;
    local_58 = (ulong)uVar9 + 0x800000;
    if (uVar16 == 0) {
      local_58 = (ulong)uVar9;
    }
    local_48 = -0x95;
    if (uVar16 != 0) {
      local_48 = (uVar16 >> 0x17) - 0x96;
    }
    bVar14 = 0xffffff < uVar16 && uVar9 == 0;
  }
  uVar16 = bVar14 + 4;
  if (local_b8 != 0x200000000) {
    uVar16 = (uint)bVar14;
  }
  iVar4 = 0x2ff;
  if (iVar15 < 0x2ff) {
    iVar4 = iVar15;
  }
  uStack_50 = 0;
  value_00._20_4_ = uStack_44;
  value_00.e = local_48;
  value_00.f._8_8_ = 0;
  value_00.f._0_8_ = local_58;
  value_00._24_8_ = uStack_40;
  format_dragon(value_00,uVar16,iVar4,buf,&local_c4);
LAB_00128d50:
  if ((uVar19 >> 0x13 & 1) == 0 && uVar10 != 0x200000000) {
    sVar18 = buf->size_;
    if (sVar18 != 0) {
      do {
        iVar15 = local_c4 + 1;
        if (buf->ptr_[sVar18 - 1] != '0') {
          uVar11 = buf->capacity_;
          if (uVar11 < sVar18) {
            (**buf->_vptr_buffer)(buf,sVar18);
            uVar11 = buf->capacity_;
          }
          goto LAB_00128d93;
        }
        sVar18 = sVar18 - 1;
        local_c4 = iVar15;
      } while (sVar18 != 0);
    }
    uVar11 = buf->capacity_;
    sVar18 = 0;
LAB_00128d93:
    if (uVar11 < sVar18) {
      sVar18 = uVar11;
    }
    buf->size_ = sVar18;
  }
  return local_c4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}